

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3mixw_io.c
# Opt level: O1

int s3mixw_intv_read(char *fn,uint32 mixw_s,uint32 mixw_e,float32 ****out_mixw,uint32 *out_n_mixw,
                    uint32 *out_n_feat,uint32 *out_n_density)

{
  uint32 *puVar1;
  int iVar2;
  FILE *fp;
  char *__s1;
  uint32 swap;
  uint32 *local_40;
  uint32 ignore;
  
  local_40 = out_n_feat;
  fp = s3open(fn,"rb",&swap);
  if (fp == (FILE *)0x0) {
    return -1;
  }
  __s1 = s3get_gvn_fattr("version");
  if (__s1 == (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
            ,0x96,"No version attribute for %s\n",fn);
  }
  else {
    iVar2 = strcmp(__s1,"1.0");
    if (iVar2 == 0) {
      s3get_gvn_fattr("chksum0");
      puVar1 = local_40;
      iVar2 = bio_fread_intv_3d(out_mixw,4,mixw_s,mixw_e,out_n_mixw,local_40,out_n_density,fp,swap,
                                &ignore);
      s3close(fp);
      if (iVar2 != 0) {
        return -1;
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
              ,0xad,"Read %s [%ux%ux%u array]\n",fn,(ulong)*out_n_mixw,(ulong)*puVar1,
              (ulong)*out_n_density);
      return 0;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3mixw_io.c"
            ,0x92,"Version mismatch for %s, file ver: %s != reader ver: %s\n",fn,__s1,"1.0");
  }
  exit(1);
}

Assistant:

int
s3mixw_intv_read(const char *fn,
		 uint32  mixw_s,
		 uint32  mixw_e,
		 float32 ****out_mixw,
		 uint32 *out_n_mixw,
		 uint32 *out_n_feat,
		 uint32 *out_n_density)
{
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, MIXW_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, MIXW_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    /* Read the mixing weight array */
    if (bio_fread_intv_3d((void ****)out_mixw,
		       sizeof(float32),
		       mixw_s,
		       mixw_e,
		       out_n_mixw,
		       out_n_feat,
		       out_n_density,
		       fp,
		       swap,
		       &ignore) != S3_SUCCESS) {
	s3close(fp);
	return S3_ERROR;
    }
    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_mixw, *out_n_feat, *out_n_density);

    return S3_SUCCESS;
}